

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

PHYSFS_File * PHYSFS_openRead(char *_fname)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined1 *ptr;
  DirHandle *pDVar3;
  FileHandle *src;
  int iVar4;
  size_t sVar5;
  PHYSFS_Io *len_00;
  char *pcVar6;
  undefined1 **ppuVar7;
  undefined1 *local_58;
  char *local_50;
  char *arcfname;
  DirHandle *i;
  PHYSFS_Io *io;
  size_t len;
  char *fname;
  char *allocated_fname;
  FileHandle *fh;
  char *_fname_local;
  
  ppuVar7 = &local_58;
  allocated_fname = (char *)0x0;
  fh = (FileHandle *)_fname;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local = (char *)0x0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    if (searchPath == (DirHandle *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_NOT_FOUND);
      __PHYSFS_platformReleaseMutex(stateLock);
      _fname_local = (char *)0x0;
    }
    else {
      sVar5 = strlen((char *)fh);
      len_00 = (PHYSFS_Io *)(sVar5 + longest_root + 2);
      if (len_00 < (PHYSFS_Io *)0x100) {
        ppuVar7 = (undefined1 **)
                  ((long)&local_58 - (sVar5 + longest_root + 0x19 & 0xfffffffffffffff0));
        local_58 = (undefined1 *)ppuVar7;
      }
      else {
        local_58 = (undefined1 *)0x0;
      }
      ptr = local_58;
      io = len_00;
      *(undefined8 *)((long)ppuVar7 + -8) = 0x10b2b1;
      fname = (char *)__PHYSFS_initSmallAlloc(ptr,(size_t)len_00);
      src = fh;
      if (fname == (char *)0x0) {
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10b2c6;
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10b2d2;
        __PHYSFS_platformReleaseMutex(stateLock);
        _fname_local = (char *)0x0;
      }
      else {
        pcVar6 = fname + longest_root + 1;
        len = (size_t)pcVar6;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10b301;
        iVar4 = sanitizePlatformIndependentPath((char *)src,pcVar6);
        if (iVar4 != 0) {
          i = (DirHandle *)0x0;
          for (arcfname = (char *)searchPath; pcVar6 = arcfname, arcfname != (char *)0x0;
              arcfname = *(char **)(arcfname + 0x30)) {
            local_50 = (char *)len;
            *(undefined8 *)((long)ppuVar7 + -8) = 0x10b33b;
            iVar4 = verifyPath((DirHandle *)pcVar6,&local_50,0);
            if (iVar4 != 0) {
              pcVar1 = *(code **)(*(long *)(arcfname + 0x28) + 0x40);
              uVar2 = *(undefined8 *)arcfname;
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10b359;
              i = (DirHandle *)(*pcVar1)(uVar2);
              if (i != (DirHandle *)0x0) break;
            }
          }
          if (i != (DirHandle *)0x0) {
            *(undefined8 *)((long)ppuVar7 + -8) = 0x10b38a;
            pcVar6 = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
            pDVar3 = i;
            allocated_fname = pcVar6;
            if (pcVar6 == (char *)0x0) {
              pcVar1 = (code *)i[1].mountPoint;
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10b3a3;
              (*pcVar1)(pDVar3);
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10b3ad;
              PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            }
            else {
              *(undefined8 *)((long)ppuVar7 + -8) = 0x10b3bf;
              memset(pcVar6,0,0x40);
              *(DirHandle **)allocated_fname = i;
              allocated_fname[8] = '\x01';
              *(char **)(allocated_fname + 0x10) = arcfname;
              *(FileHandle **)(allocated_fname + 0x38) = openReadList;
              openReadList = (FileHandle *)allocated_fname;
            }
          }
        }
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10b408;
        __PHYSFS_platformReleaseMutex(stateLock);
        pcVar6 = fname;
        *(undefined8 *)((long)ppuVar7 + -8) = 0x10b411;
        __PHYSFS_smallFree(pcVar6);
        _fname_local = allocated_fname;
      }
    }
  }
  return (PHYSFS_File *)_fname_local;
}

Assistant:

PHYSFS_File *PHYSFS_openRead(const char *_fname)
{
    FileHandle *fh = NULL;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    BAIL_IF_MUTEX(!searchPath, PHYSFS_ERR_NOT_FOUND, stateLock, 0);

    len = strlen(_fname) + longest_root + 2;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root + 1;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        PHYSFS_Io *io = NULL;
        DirHandle *i;

        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (verifyPath(i, &arcfname, 0))
            {
                io = i->funcs->openRead(i->opaque, arcfname);
                if (io)
                    break;
            } /* if */
        } /* for */

        if (io)
        {
            fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
            if (fh == NULL)
            {
                io->destroy(io);
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            } /* if */
            else
            {
                memset(fh, '\0', sizeof (FileHandle));
                fh->io = io;
                fh->forReading = 1;
                fh->dirHandle = i;
                fh->next = openReadList;
                openReadList = fh;
            } /* else */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return ((PHYSFS_File *) fh);
}